

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_cab_filename.c
# Opt level: O0

void test_read_format_cab_filename(void)

{
  char *refname;
  char *in_stack_00000010;
  char *in_stack_00000410;
  
  extract_reference_file(in_stack_00000410);
  test_read_format_cab_filename_CP932_eucJP(in_stack_00000010);
  test_read_format_cab_filename_CP932_UTF8(in_stack_00000010);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_cab_filename)
{
	const char *refname = "test_read_format_cab_filename_cp932.cab";

	extract_reference_file(refname);
	test_read_format_cab_filename_CP932_eucJP(refname);
	test_read_format_cab_filename_CP932_UTF8(refname);
}